

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_optimum_fast.c
# Opt level: O2

void lzma_lzma_optimum_fast
               (lzma_lzma1_encoder *coder,lzma_mf *mf,uint32_t *back_res,uint32_t *len_res)

{
  uint8_t *__s1;
  ulong uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  int iVar5;
  undefined4 extraout_var;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  size_t __n;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint32_t i;
  long lVar15;
  short *psVar16;
  uint32_t matches_count;
  uint32_t *local_50;
  uint32_t *local_48;
  lzma_mf *local_40;
  ulong local_38;
  ulong uVar6;
  
  uVar14 = mf->nice_len;
  if (mf->read_ahead == 1) {
    matches_count = coder->matches_count;
    uVar6 = (ulong)coder->longest_match_length;
  }
  else {
    if (mf->read_ahead != 0) {
      __assert_fail("mf->read_ahead == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_fast.c"
                    ,0x20,
                    "void lzma_lzma_optimum_fast(lzma_lzma1_encoder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict)"
                   );
    }
    uVar2 = lzma_mf_find(mf,&matches_count,coder->matches);
    uVar6 = CONCAT44(extraout_var,uVar2);
  }
  uVar11 = mf->read_pos;
  uVar8 = (mf->write_pos - uVar11) + 1;
  uVar13 = 0x111;
  if (uVar8 < 0x111) {
    uVar13 = uVar8;
  }
  if (uVar8 < 2) {
    *back_res = 0xffffffff;
    *len_res = 1;
    return;
  }
  __s1 = mf->buffer + uVar11;
  psVar16 = (short *)(mf->buffer + ((ulong)uVar11 - 1));
  uVar9 = 0;
  uVar11 = 0;
  for (uVar12 = 0; local_38 = uVar6, local_50 = back_res, local_48 = len_res, local_40 = mf,
      uVar12 != 4; uVar12 = uVar12 + 1) {
    if (*psVar16 == *(short *)(__s1 + (-2 - (ulong)coder->reps[uVar12]))) {
      uVar7 = 2;
LAB_0036b493:
      uVar3 = uVar13;
      if (uVar7 < uVar13) {
        uVar10 = *(long *)((long)psVar16 + uVar7) -
                 *(long *)(__s1 + uVar7 + (-2 - (ulong)coder->reps[uVar12]));
        if (uVar10 == 0) goto code_r0x0036b4a3;
        uVar1 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
          }
        }
        uVar3 = (int)uVar7 + ((uint)(uVar1 >> 3) & 0x1fffffff);
        if (uVar13 <= uVar3) {
          uVar3 = uVar13;
        }
      }
      if (uVar14 <= uVar3) {
        *back_res = (uint32_t)uVar12;
        *len_res = uVar3;
        uVar2 = uVar3 - 1;
        goto LAB_0036b5d3;
      }
      if (uVar11 < uVar3) {
        uVar9 = uVar12 & 0xffffffff;
        uVar11 = uVar3;
      }
    }
  }
  uVar13 = (uint)uVar6;
  if (uVar14 <= uVar13) {
    *back_res = coder->matches[matches_count - 1].dist + 4;
    *len_res = uVar13;
    uVar2 = uVar13 - 1;
LAB_0036b5d3:
    mf_skip(local_40,uVar2);
    return;
  }
  uVar2 = 0;
  if (1 < uVar13) {
    uVar7 = (ulong)matches_count;
    uVar12 = uVar6;
    uVar2 = coder->matches[matches_count - 1].dist;
    while (((uVar14 = (uint)uVar12, 1 < uVar7 &&
            (lVar15 = uVar7 * 2, uVar14 == coder->reps[lVar15] + 1)) &&
           (uVar13 = coder->matches[uVar7 - 2].dist, uVar13 < uVar2 >> 7))) {
      uVar7 = uVar7 - 1;
      matches_count = (uint32_t)uVar7;
      uVar12 = (ulong)coder->reps[lVar15];
      uVar2 = uVar13;
    }
    uVar13 = 1;
    if (uVar2 < 0x80) {
      uVar13 = uVar14;
    }
    if (uVar14 != 2) {
      uVar13 = uVar14;
    }
    local_38 = (ulong)uVar13;
  }
  uVar14 = (uint)local_38;
  if ((1 < uVar11) &&
     (((uVar14 <= uVar11 + 1 || ((uVar14 <= uVar11 + 2 && (0x200 < uVar2)))) ||
      ((uVar14 <= uVar11 + 3 && (0x8000 < uVar2)))))) {
    *back_res = (uint32_t)uVar9;
    *len_res = uVar11;
    uVar2 = uVar11 - 1;
    local_38 = uVar6;
    goto LAB_0036b5d3;
  }
  if ((uVar8 == 2) || (uVar14 < 2)) goto LAB_0036b6b2;
  uVar4 = lzma_mf_find(mf,&coder->matches_count,coder->matches);
  coder->longest_match_length = uVar4;
  uVar14 = (uint)local_38;
  if (1 < uVar4) {
    uVar11 = coder->matches[coder->matches_count - 1].dist;
    if ((uVar14 <= uVar4) && (uVar11 < uVar2)) goto LAB_0036b6b2;
    if (((uVar14 + 1 < uVar4) || (uVar4 == uVar14 + 1 && uVar11 >> 7 <= uVar2)) ||
       (((2 < uVar14 && (uVar14 <= uVar4 + 1)) && (uVar11 < uVar2 >> 7)))) goto LAB_0036b6b2;
  }
  __n = 2;
  if (2 < uVar14 - 1) {
    __n = (size_t)(uVar14 - 1);
  }
  lVar15 = 0;
  do {
    if (lVar15 == 4) {
      *local_50 = uVar2 + 4;
      *local_48 = (uint32_t)local_38;
      uVar2 = (uint32_t)local_38 - 2;
      goto LAB_0036b5d3;
    }
    iVar5 = bcmp(__s1,(void *)((long)psVar16 - (ulong)coder->reps[lVar15]),__n);
    lVar15 = lVar15 + 1;
  } while (iVar5 != 0);
LAB_0036b6b2:
  *local_50 = 0xffffffff;
  *local_48 = 1;
  return;
code_r0x0036b4a3:
  uVar7 = uVar7 + 8;
  goto LAB_0036b493;
}

Assistant:

extern void
lzma_lzma_optimum_fast(lzma_lzma1_encoder *restrict coder,
		lzma_mf *restrict mf,
		uint32_t *restrict back_res, uint32_t *restrict len_res)
{
	const uint32_t nice_len = mf->nice_len;

	uint32_t len_main;
	uint32_t matches_count;
	if (mf->read_ahead == 0) {
		len_main = mf_find(mf, &matches_count, coder->matches);
	} else {
		assert(mf->read_ahead == 1);
		len_main = coder->longest_match_length;
		matches_count = coder->matches_count;
	}

	const uint8_t *buf = mf_ptr(mf) - 1;
	const uint32_t buf_avail = my_min(mf_avail(mf) + 1, MATCH_LEN_MAX);

	if (buf_avail < 2) {
		// There's not enough input left to encode a match.
		*back_res = UINT32_MAX;
		*len_res = 1;
		return;
	}

	// Look for repeated matches; scan the previous four match distances
	uint32_t rep_len = 0;
	uint32_t rep_index = 0;

	for (uint32_t i = 0; i < REPS; ++i) {
		// Pointer to the beginning of the match candidate
		const uint8_t *const buf_back = buf - coder->reps[i] - 1;

		// If the first two bytes (2 == MATCH_LEN_MIN) do not match,
		// this rep is not useful.
		if (not_equal_16(buf, buf_back))
			continue;

		// The first two bytes matched.
		// Calculate the length of the match.
		const uint32_t len = lzma_memcmplen(
				buf, buf_back, 2, buf_avail);

		// If we have found a repeated match that is at least
		// nice_len long, return it immediately.
		if (len >= nice_len) {
			*back_res = i;
			*len_res = len;
			mf_skip(mf, len - 1);
			return;
		}

		if (len > rep_len) {
			rep_index = i;
			rep_len = len;
		}
	}

	// We didn't find a long enough repeated match. Encode it as a normal
	// match if the match length is at least nice_len.
	if (len_main >= nice_len) {
		*back_res = coder->matches[matches_count - 1].dist + REPS;
		*len_res = len_main;
		mf_skip(mf, len_main - 1);
		return;
	}

	uint32_t back_main = 0;
	if (len_main >= 2) {
		back_main = coder->matches[matches_count - 1].dist;

		while (matches_count > 1 && len_main ==
				coder->matches[matches_count - 2].len + 1) {
			if (!change_pair(coder->matches[
						matches_count - 2].dist,
					back_main))
				break;

			--matches_count;
			len_main = coder->matches[matches_count - 1].len;
			back_main = coder->matches[matches_count - 1].dist;
		}

		if (len_main == 2 && back_main >= 0x80)
			len_main = 1;
	}

	if (rep_len >= 2) {
		if (rep_len + 1 >= len_main
				|| (rep_len + 2 >= len_main
					&& back_main > (UINT32_C(1) << 9))
				|| (rep_len + 3 >= len_main
					&& back_main > (UINT32_C(1) << 15))) {
			*back_res = rep_index;
			*len_res = rep_len;
			mf_skip(mf, rep_len - 1);
			return;
		}
	}

	if (len_main < 2 || buf_avail <= 2) {
		*back_res = UINT32_MAX;
		*len_res = 1;
		return;
	}

	// Get the matches for the next byte. If we find a better match,
	// the current byte is encoded as a literal.
	coder->longest_match_length = mf_find(mf,
			&coder->matches_count, coder->matches);

	if (coder->longest_match_length >= 2) {
		const uint32_t new_dist = coder->matches[
				coder->matches_count - 1].dist;

		if ((coder->longest_match_length >= len_main
					&& new_dist < back_main)
				|| (coder->longest_match_length == len_main + 1
					&& !change_pair(back_main, new_dist))
				|| (coder->longest_match_length > len_main + 1)
				|| (coder->longest_match_length + 1 >= len_main
					&& len_main >= 3
					&& change_pair(new_dist, back_main))) {
			*back_res = UINT32_MAX;
			*len_res = 1;
			return;
		}
	}

	// In contrast to LZMA SDK, dictionary could not have been moved
	// between mf_find() calls, thus it is safe to just increment
	// the old buf pointer instead of recalculating it with mf_ptr().
	++buf;

	const uint32_t limit = my_max(2, len_main - 1);

	for (uint32_t i = 0; i < REPS; ++i) {
		if (memcmp(buf, buf - coder->reps[i] - 1, limit) == 0) {
			*back_res = UINT32_MAX;
			*len_res = 1;
			return;
		}
	}

	*back_res = back_main + REPS;
	*len_res = len_main;
	mf_skip(mf, len_main - 2);
	return;
}